

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_avcc.cpp
# Opt level: O3

int read_avcc(avcc_t *avcc,h264_stream_t *h,bs_t *b)

{
  byte bVar1;
  uint32_t r;
  int iVar2;
  uint uVar3;
  uint uVar4;
  sps_t **ppsVar5;
  uint8_t *puVar6;
  pps_t **pppVar7;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  byte *pbVar11;
  uint32_t r_7;
  uint uVar12;
  long lVar13;
  uint32_t r_5;
  bool bVar14;
  
  uVar8 = b->bits_left;
  if (uVar8 == 8) {
    pbVar9 = b->p;
    pbVar11 = b->end;
    if (pbVar11 <= pbVar9) goto LAB_00104441;
    bVar1 = *pbVar9;
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    avcc->configurationVersion = (uint)bVar1;
LAB_00104490:
    uVar8 = 8;
    if (pbVar11 <= pbVar9) goto LAB_001044b0;
    bVar1 = *pbVar9;
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    avcc->AVCProfileIndication = (uint)bVar1;
LAB_00104500:
    uVar8 = 8;
    if (pbVar11 <= pbVar9) goto LAB_00104520;
    bVar1 = *pbVar9;
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    avcc->profile_compatibility = (uint)bVar1;
LAB_00104570:
    uVar8 = 8;
    if (pbVar9 < pbVar11) {
      uVar3 = (uint)*pbVar9;
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      goto LAB_001045cb;
    }
  }
  else {
    pbVar9 = b->p;
    pbVar11 = b->end;
LAB_00104441:
    uVar3 = 0;
    iVar2 = 7;
    do {
      uVar8 = uVar8 - 1;
      b->bits_left = uVar8;
      uVar12 = 0;
      if (pbVar9 < pbVar11) {
        uVar12 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
      }
      if (uVar8 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar8 = 8;
      }
      uVar3 = uVar3 | uVar12 << ((byte)iVar2 & 0x1f);
      bVar14 = iVar2 != 0;
      iVar2 = iVar2 + -1;
    } while (bVar14);
    avcc->configurationVersion = uVar3;
    if (uVar8 == 8) goto LAB_00104490;
LAB_001044b0:
    uVar3 = 0;
    iVar2 = 7;
    do {
      uVar8 = uVar8 - 1;
      b->bits_left = uVar8;
      uVar12 = 0;
      if (pbVar9 < pbVar11) {
        uVar12 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
      }
      if (uVar8 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar8 = 8;
      }
      uVar3 = uVar3 | uVar12 << ((byte)iVar2 & 0x1f);
      bVar14 = iVar2 != 0;
      iVar2 = iVar2 + -1;
    } while (bVar14);
    avcc->AVCProfileIndication = uVar3;
    if (uVar8 == 8) goto LAB_00104500;
LAB_00104520:
    uVar3 = 0;
    iVar2 = 7;
    do {
      uVar8 = uVar8 - 1;
      b->bits_left = uVar8;
      uVar12 = 0;
      if (pbVar9 < pbVar11) {
        uVar12 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
      }
      if (uVar8 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar8 = 8;
      }
      uVar3 = uVar3 | uVar12 << ((byte)iVar2 & 0x1f);
      bVar14 = iVar2 != 0;
      iVar2 = iVar2 + -1;
    } while (bVar14);
    avcc->profile_compatibility = uVar3;
    if (uVar8 == 8) goto LAB_00104570;
  }
  uVar3 = 0;
  iVar2 = 7;
  do {
    uVar8 = uVar8 - 1;
    b->bits_left = uVar8;
    uVar12 = 0;
    if (pbVar9 < pbVar11) {
      uVar12 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
    }
    if (uVar8 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar8 = 8;
    }
    uVar3 = uVar3 | uVar12 << ((byte)iVar2 & 0x1f);
    bVar14 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar14);
LAB_001045cb:
  avcc->AVCLevelIndication = uVar3;
  iVar2 = 6;
  do {
    uVar8 = uVar8 - 1;
    if (uVar8 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      uVar8 = 8;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  uVar3 = 0;
  iVar2 = 1;
  do {
    uVar8 = uVar8 - 1;
    b->bits_left = uVar8;
    uVar12 = 0;
    if (pbVar9 < pbVar11) {
      uVar12 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
    }
    if (uVar8 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar8 = 8;
    }
    uVar3 = uVar3 | uVar12 << ((byte)iVar2 & 0x1f);
    bVar14 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar14);
  avcc->lengthSizeMinusOne = uVar3;
  iVar2 = 3;
  do {
    uVar8 = uVar8 - 1;
    if (uVar8 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      uVar8 = 8;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  uVar3 = 0;
  iVar2 = 4;
  do {
    uVar8 = uVar8 - 1;
    b->bits_left = uVar8;
    uVar12 = 0;
    if (pbVar9 < pbVar11) {
      uVar12 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
    }
    if (uVar8 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar8 = 8;
    }
    uVar3 = uVar3 | uVar12 << ((byte)iVar2 & 0x1f);
    bVar14 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar14);
  avcc->numOfSequenceParameterSets = uVar3;
  ppsVar5 = (sps_t **)calloc((ulong)uVar3,8);
  avcc->sps_table = ppsVar5;
  if (0 < (int)uVar3) {
    lVar13 = 0;
    do {
      pbVar9 = b->p;
      pbVar11 = b->end;
      uVar8 = b->bits_left;
      iVar2 = 0xf;
      uVar3 = 0;
      do {
        uVar8 = uVar8 - 1;
        b->bits_left = uVar8;
        uVar12 = 0;
        if (pbVar9 < pbVar11) {
          uVar12 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar8 = 8;
        }
        uVar3 = uVar3 | uVar12 << ((byte)iVar2 & 0x1f);
        bVar14 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar14);
      puVar6 = (uint8_t *)malloc((ulong)uVar3);
      lVar10 = (long)pbVar11 - (long)pbVar9;
      uVar8 = (uint)lVar10;
      if ((long)(ulong)uVar3 <= lVar10) {
        uVar8 = uVar3;
      }
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      memcpy(puVar6,pbVar9,(ulong)uVar8);
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      b->p = pbVar9 + uVar3;
      iVar2 = read_nal_unit(h,puVar6,uVar8);
      free(puVar6);
      if ((-1 < iVar2) && (h->nal->nal_unit_type == 7)) {
        avcc->sps_table[lVar13] = h->sps;
      }
      lVar13 = lVar13 + 1;
      uVar3 = avcc->numOfSequenceParameterSets;
    } while (lVar13 < (int)uVar3);
    pbVar9 = b->p;
    pbVar11 = b->end;
    uVar8 = b->bits_left;
  }
  uVar12 = 0;
  iVar2 = 7;
  do {
    uVar8 = uVar8 - 1;
    b->bits_left = uVar8;
    uVar4 = 0;
    if (pbVar9 < pbVar11) {
      uVar4 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
    }
    if (uVar8 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar8 = 8;
    }
    uVar12 = uVar12 | uVar4 << ((byte)iVar2 & 0x1f);
    bVar14 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar14);
  avcc->numOfPictureParameterSets = uVar12;
  pppVar7 = (pps_t **)calloc((long)(int)uVar3,8);
  avcc->pps_table = pppVar7;
  if (0 < (int)uVar12) {
    lVar13 = 0;
    do {
      pbVar9 = b->p;
      pbVar11 = b->end;
      uVar8 = b->bits_left;
      iVar2 = 0xf;
      uVar3 = 0;
      do {
        uVar8 = uVar8 - 1;
        b->bits_left = uVar8;
        uVar12 = 0;
        if (pbVar9 < pbVar11) {
          uVar12 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar8 = 8;
        }
        uVar3 = uVar3 | uVar12 << ((byte)iVar2 & 0x1f);
        bVar14 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar14);
      puVar6 = (uint8_t *)malloc((ulong)uVar3);
      lVar10 = (long)pbVar11 - (long)pbVar9;
      uVar8 = (uint)lVar10;
      if ((long)(ulong)uVar3 <= lVar10) {
        uVar8 = uVar3;
      }
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      memcpy(puVar6,pbVar9,(ulong)uVar8);
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      b->p = pbVar9 + uVar3;
      iVar2 = read_nal_unit(h,puVar6,uVar8);
      free(puVar6);
      if ((-1 < iVar2) && (h->nal->nal_unit_type == 8)) {
        avcc->pps_table[lVar13] = h->pps;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < avcc->numOfPictureParameterSets);
    pbVar9 = b->p;
    pbVar11 = b->end;
  }
  iVar2 = -1;
  if (pbVar9 <= pbVar11) {
    iVar2 = (int)pbVar9 - *(int *)&b->start;
  }
  return iVar2;
}

Assistant:

int read_avcc(avcc_t* avcc, h264_stream_t* h, bs_t* b)
{
    avcc->configurationVersion = bs_read_u8(b);
    avcc->AVCProfileIndication = bs_read_u8(b);
    avcc->profile_compatibility = bs_read_u8(b);
    avcc->AVCLevelIndication = bs_read_u8(b);
    /* int reserved = */ bs_read_u(b, 6); // '111111'b;
    avcc->lengthSizeMinusOne = bs_read_u(b, 2);
    /* int reserved = */ bs_read_u(b, 3); // '111'b;

    avcc->numOfSequenceParameterSets = bs_read_u(b, 5);
    avcc->sps_table = (sps_t**)calloc(avcc->numOfSequenceParameterSets, sizeof(sps_t*));
    for (int i = 0; i < avcc->numOfSequenceParameterSets; i++)
    {
        int sequenceParameterSetLength = bs_read_u(b, 16);
        int len = sequenceParameterSetLength;
        uint8_t* buf = (uint8_t*)malloc(len);
        len = bs_read_bytes(b, buf, len);
        int rc = read_nal_unit(h, buf, len);
        free(buf);
        if (h->nal->nal_unit_type != NAL_UNIT_TYPE_SPS) { continue; } // TODO report errors
        if (rc < 0) { continue; }
        avcc->sps_table[i] = h->sps; // TODO copy data?
    }

    avcc->numOfPictureParameterSets = bs_read_u(b, 8);
    avcc->pps_table = (pps_t**)calloc(avcc->numOfSequenceParameterSets, sizeof(pps_t*));
    for (int i = 0; i < avcc->numOfPictureParameterSets; i++)
    {
        int pictureParameterSetLength = bs_read_u(b, 16);
        int len = pictureParameterSetLength;
        uint8_t* buf = (uint8_t*)malloc(len);
        len = bs_read_bytes(b, buf, len);
        int rc = read_nal_unit(h, buf, len);
        free(buf);
        if (h->nal->nal_unit_type != NAL_UNIT_TYPE_PPS) { continue; } // TODO report errors
        if (rc < 0) { continue; }
        avcc->pps_table[i] = h->pps; // TODO copy data?
    }

    if (bs_overrun(b)) { return -1; }
    return bs_pos(b);
}